

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O0

void __thiscall kj::_::FiberStack::switchToFiber(FiberStack *this)

{
  int iVar1;
  FiberStack *this_local;
  
  iVar1 = _setjmp((__jmp_buf_tag *)this->impl->originalJmpBuf);
  if (iVar1 == 0) {
    _longjmp((__jmp_buf_tag *)this->impl,1);
  }
  return;
}

Assistant:

void FiberStack::switchToFiber() {
  // Switch from the main stack to the fiber. Returns once the fiber either calls switchToMain()
  // or returns from its main function.
#if KJ_USE_FIBERS
#if _WIN32 || __CYGWIN__
  SwitchToFiber(osFiber);
#else
  __sanitizer_start_switch_fiber(&impl->originalFakeStack, impl, stackSize - sizeof(Impl));
  if (_setjmp(impl->originalJmpBuf) == 0) {
    _longjmp(impl->fiberJmpBuf, 1);
  }
  __sanitizer_finish_switch_fiber(impl->originalFakeStack, nullptr, nullptr);
#endif
#endif
}